

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

int Ivy_ManCleanup(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pObj;
  int i;
  
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if (((pObj != (Ivy_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x8 & 0xc) == 4)) &&
       (pObj->nRefs == 0)) {
      Ivy_ObjDelete_rec(p,pObj,1);
    }
  }
  return (iVar2 + iVar1) - (p->nObjs[5] + p->nObjs[6]);
}

Assistant:

int Ivy_ManCleanup( Ivy_Man_t * p )
{
    Ivy_Obj_t * pNode;
    int i, nNodesOld;
    nNodesOld = Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pNode, i )
        if ( Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) )
            if ( Ivy_ObjRefs(pNode) == 0 )
                Ivy_ObjDelete_rec( p, pNode, 1 );
//printf( "Cleanup removed %d nodes.\n", nNodesOld - Ivy_ManNodeNum(p) );
    return nNodesOld - Ivy_ManNodeNum(p);
}